

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dequantize.cpp
# Opt level: O0

int __thiscall
ncnn::Dequantize::forward(Dequantize *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  float fVar1;
  float fVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  long lVar10;
  long lVar11;
  long lVar12;
  int iVar13;
  long *in_RDX;
  long *in_RSI;
  long in_RDI;
  bool bVar14;
  int i_9;
  float bias_3;
  float scale_4;
  float *ptr_4;
  int *intptr_4;
  int q_1;
  int i_8;
  float scale_3;
  float *ptr_3;
  int *intptr_3;
  int q;
  int size;
  int channels;
  int h_1;
  int w_2;
  int j_1;
  float bias_2;
  float scale_2;
  float *ptr_2;
  int *intptr_2;
  int i_7;
  int j;
  float scale_1;
  float *ptr_1;
  int *intptr_1;
  int i_6;
  int h;
  int w_1;
  int i_5;
  int i_4;
  float bias_1;
  int i_3;
  int i_2;
  int i_1;
  float bias;
  int i;
  float scale;
  float *ptr;
  int *intptr;
  int w;
  int dims;
  Mat *m_2;
  Mat *m;
  Mat *m_3;
  Mat *m_1;
  float local_800;
  float local_7fc;
  Allocator *in_stack_fffffffffffff808;
  Allocator *in_stack_fffffffffffff810;
  size_t in_stack_fffffffffffff818;
  Mat *in_stack_fffffffffffff820;
  undefined8 in_stack_fffffffffffff828;
  Mat *in_stack_fffffffffffff830;
  float local_7a4;
  float local_744;
  float local_740;
  float local_73c;
  int local_70c;
  int local_65c;
  int local_658;
  int local_5a0;
  int local_58c;
  int local_56c;
  int local_568;
  int local_550;
  int local_544;
  int local_540;
  int local_538;
  int local_534;
  int local_530;
  int local_528;
  
  iVar13 = (int)in_RSI[5];
  if (iVar13 == 1) {
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    Mat::create(in_stack_fffffffffffff820,(int)(in_stack_fffffffffffff818 >> 0x20),
                (size_t)in_stack_fffffffffffff810,in_stack_fffffffffffff808);
    bVar14 = true;
    if (*in_RDX != 0) {
      bVar14 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
    }
    if (bVar14) {
      return -100;
    }
    lVar6 = *in_RSI;
    lVar7 = *in_RDX;
    if (*(int *)(in_RDI + 0xd0) == 1) {
      fVar1 = **(float **)(in_RDI + 0xd8);
      if (*(int *)(in_RDI + 0xd4) == 0) {
        for (local_528 = 0; local_528 < iVar3; local_528 = local_528 + 1) {
          *(float *)(lVar7 + (long)local_528 * 4) =
               (float)*(int *)(lVar6 + (long)local_528 * 4) * fVar1;
        }
      }
      else if (*(int *)(in_RDI + 0xd4) == 1) {
        fVar2 = **(float **)(in_RDI + 0x120);
        for (local_530 = 0; local_530 < iVar3; local_530 = local_530 + 1) {
          *(float *)(lVar7 + (long)local_530 * 4) =
               (float)*(int *)(lVar6 + (long)local_530 * 4) * fVar1 + fVar2;
        }
      }
      else {
        for (local_534 = 0; local_534 < iVar3; local_534 = local_534 + 1) {
          *(float *)(lVar7 + (long)local_534 * 4) =
               (float)*(int *)(lVar6 + (long)local_534 * 4) * fVar1 +
               *(float *)(*(long *)(in_RDI + 0x120) + (long)local_534 * 4);
        }
      }
    }
    else if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_538 = 0; local_538 < iVar3; local_538 = local_538 + 1) {
        *(float *)(lVar7 + (long)local_538 * 4) =
             (float)*(int *)(lVar6 + (long)local_538 * 4) *
             *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_538 * 4);
      }
    }
    else if (*(int *)(in_RDI + 0xd4) == 1) {
      fVar1 = **(float **)(in_RDI + 0x120);
      for (local_540 = 0; local_540 < iVar3; local_540 = local_540 + 1) {
        *(float *)(lVar7 + (long)local_540 * 4) =
             (float)*(int *)(lVar6 + (long)local_540 * 4) *
             *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_540 * 4) + fVar1;
      }
    }
    else {
      for (local_544 = 0; local_544 < iVar3; local_544 = local_544 + 1) {
        *(float *)(lVar7 + (long)local_544 * 4) =
             (float)*(int *)(lVar6 + (long)local_544 * 4) *
             *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_544 * 4) +
             *(float *)(*(long *)(in_RDI + 0x120) + (long)local_544 * 4);
      }
    }
  }
  if (iVar13 == 2) {
    iVar3 = *(int *)((long)in_RSI + 0x2c);
    lVar6 = in_RSI[6];
    Mat::create(in_stack_fffffffffffff820,(int)(in_stack_fffffffffffff818 >> 0x20),
                (int)in_stack_fffffffffffff818,(size_t)in_stack_fffffffffffff810,
                in_stack_fffffffffffff808);
    bVar14 = true;
    if (*in_RDX != 0) {
      bVar14 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
    }
    if (bVar14) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_550 = 0; local_550 < (int)lVar6; local_550 = local_550 + 1) {
        lVar7 = *in_RSI;
        iVar4 = *(int *)((long)in_RSI + 0x2c);
        lVar8 = in_RSI[2];
        lVar9 = *in_RDX;
        iVar5 = *(int *)((long)in_RDX + 0x2c);
        lVar10 = in_RDX[2];
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_73c = **(float **)(in_RDI + 0xd8);
        }
        else {
          local_73c = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_550 * 4);
        }
        for (local_568 = 0; local_568 < iVar3; local_568 = local_568 + 1) {
          *(float *)(lVar9 + (long)iVar5 * (long)local_550 * lVar10 + (long)local_568 * 4) =
               (float)*(int *)(lVar7 + (long)iVar4 * (long)local_550 * lVar8 + (long)local_568 * 4)
               * local_73c;
        }
      }
    }
    else {
      for (local_56c = 0; local_56c < (int)lVar6; local_56c = local_56c + 1) {
        lVar7 = *in_RSI;
        iVar4 = *(int *)((long)in_RSI + 0x2c);
        lVar8 = in_RSI[2];
        lVar9 = *in_RDX;
        iVar5 = *(int *)((long)in_RDX + 0x2c);
        lVar10 = in_RDX[2];
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_740 = **(float **)(in_RDI + 0xd8);
        }
        else {
          local_740 = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_56c * 4);
        }
        if (*(int *)(in_RDI + 0xd4) == 1) {
          local_744 = **(float **)(in_RDI + 0x120);
        }
        else {
          local_744 = *(float *)(*(long *)(in_RDI + 0x120) + (long)local_56c * 4);
        }
        for (local_58c = 0; local_58c < iVar3; local_58c = local_58c + 1) {
          *(float *)(lVar9 + (long)iVar5 * (long)local_56c * lVar10 + (long)local_58c * 4) =
               (float)*(int *)(lVar7 + (long)iVar4 * (long)local_56c * lVar8 + (long)local_58c * 4)
               * local_740 + local_744;
        }
      }
    }
  }
  if (iVar13 == 3) {
    lVar6 = in_RSI[7];
    iVar13 = *(int *)((long)in_RSI + 0x2c) * (int)in_RSI[6];
    Mat::create(in_stack_fffffffffffff830,(int)((ulong)in_stack_fffffffffffff828 >> 0x20),
                (int)in_stack_fffffffffffff828,(int)((ulong)in_stack_fffffffffffff820 >> 0x20),
                in_stack_fffffffffffff818,in_stack_fffffffffffff810);
    bVar14 = true;
    if (*in_RDX != 0) {
      bVar14 = in_RDX[8] * (long)(int)in_RDX[7] == 0;
    }
    if (bVar14) {
      return -100;
    }
    if (*(int *)(in_RDI + 0xd4) == 0) {
      for (local_5a0 = 0; local_5a0 < (int)lVar6; local_5a0 = local_5a0 + 1) {
        lVar7 = *in_RSI;
        lVar8 = in_RSI[8];
        lVar9 = in_RSI[2];
        lVar10 = *in_RDX;
        lVar11 = in_RDX[8];
        lVar12 = in_RDX[2];
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_7a4 = **(float **)(in_RDI + 0xd8);
        }
        else {
          local_7a4 = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_5a0 * 4);
        }
        for (local_658 = 0; local_658 < iVar13; local_658 = local_658 + 1) {
          *(float *)(lVar10 + lVar11 * local_5a0 * lVar12 + (long)local_658 * 4) =
               (float)*(int *)(lVar7 + lVar8 * local_5a0 * lVar9 + (long)local_658 * 4) * local_7a4;
        }
      }
    }
    else {
      for (local_65c = 0; local_65c < (int)lVar6; local_65c = local_65c + 1) {
        lVar7 = *in_RSI;
        lVar8 = in_RSI[8];
        lVar9 = in_RSI[2];
        lVar10 = *in_RDX;
        lVar11 = in_RDX[8];
        lVar12 = in_RDX[2];
        if (*(int *)(in_RDI + 0xd0) == 1) {
          local_7fc = **(float **)(in_RDI + 0xd8);
        }
        else {
          local_7fc = *(float *)(*(long *)(in_RDI + 0xd8) + (long)local_65c * 4);
        }
        if (*(int *)(in_RDI + 0xd4) == 1) {
          local_800 = **(float **)(in_RDI + 0x120);
        }
        else {
          local_800 = *(float *)(*(long *)(in_RDI + 0x120) + (long)local_65c * 4);
        }
        for (local_70c = 0; local_70c < iVar13; local_70c = local_70c + 1) {
          *(float *)(lVar10 + lVar11 * local_65c * lVar12 + (long)local_70c * 4) =
               (float)*(int *)(lVar7 + lVar8 * local_65c * lVar9 + (long)local_70c * 4) * local_7fc
               + local_800;
        }
      }
    }
  }
  return 0;
}

Assistant:

int Dequantize::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int dims = bottom_blob.dims;

    if (dims == 1)
    {
        int w = bottom_blob.w;

        top_blob.create(w, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        const int* intptr = bottom_blob;
        float* ptr = top_blob;

        if (scale_data_size == 1)
        {
            const float scale = scale_data[0];

            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale + bias_data[i];
                }
            }
        }
        else
        {
            if (bias_data_size == 0)
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i];
                }
            }
            else if (bias_data_size == 1)
            {
                const float bias = bias_data[0];

                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias;
                }
            }
            else
            {
                #pragma omp parallel for num_threads(opt.num_threads)
                for (int i = 0; i < w; i++)
                {
                    ptr[i] = intptr[i] * scale_data[i] + bias_data[i];
                }
            }
        }
    }

    if (dims == 2)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;

        top_blob.create(w, h, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int i = 0; i < h; i++)
            {
                const int* intptr = bottom_blob.row<const int>(i);
                float* ptr = top_blob.row(i);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[i];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[i];

                for (int j = 0; j < w; j++)
                {
                    ptr[j] = intptr[j] * scale + bias;
                }
            }
        }
    }

    if (dims == 3)
    {
        int w = bottom_blob.w;
        int h = bottom_blob.h;
        int channels = bottom_blob.c;
        int size = w * h;

        top_blob.create(w, h, channels, (size_t)4u, opt.blob_allocator);
        if (top_blob.empty())
            return -100;

        if (bias_data_size == 0)
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale;
                }
            }
        }
        else
        {
            #pragma omp parallel for num_threads(opt.num_threads)
            for (int q = 0; q < channels; q++)
            {
                const int* intptr = bottom_blob.channel(q);
                float* ptr = top_blob.channel(q);

                const float scale = scale_data_size == 1 ? scale_data[0] : scale_data[q];
                const float bias = bias_data_size == 1 ? bias_data[0] : bias_data[q];

                for (int i = 0; i < size; i++)
                {
                    ptr[i] = intptr[i] * scale + bias;
                }
            }
        }
    }

    return 0;
}